

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
* libtorrent::anon_unknown_62::read_nodes
            (vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
             *__return_storage_ptr__,stack_allocator *alloc,int v4_num_nodes,
            allocation_slot v4_nodes_idx,int v6_num_nodes,allocation_slot v6_nodes_idx)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  basic_endpoint<boost::asio::ip::udp> local_d0;
  undefined1 local_b4 [8];
  sha1_hash ih_1;
  int i_1;
  char *v6_ptr;
  undefined1 local_74 [8];
  sha1_hash ih;
  int i;
  char *v4_ptr;
  undefined1 local_40 [8];
  vector<std::pair<sha1_hash,_udp::endpoint>_> nodes;
  int v6_num_nodes_local;
  int v4_num_nodes_local;
  stack_allocator *alloc_local;
  allocation_slot v6_nodes_idx_local;
  allocation_slot v4_nodes_idx_local;
  
  nodes.
  super_vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  .
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = v6_num_nodes;
  nodes.
  super_vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  .
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = v4_num_nodes;
  libtorrent::aux::
  container_wrapper<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_int,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>_>
  ::container_wrapper((container_wrapper<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_int,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>_>
                       *)local_40);
  libtorrent::aux::
  container_wrapper<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,int,std::vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>>
  ::reserve<int,void>((container_wrapper<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,int,std::vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>>
                       *)local_40,
                      nodes.
                      super_vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                      .
                      super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ +
                      (int)nodes.
                           super_vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                           .
                           super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ih.m_number._M_elems[4] = v4_nodes_idx.m_idx;
  _i = libtorrent::aux::stack_allocator::ptr(alloc,v4_nodes_idx);
  for (ih.m_number._M_elems[3] = 0;
      (int)ih.m_number._M_elems[3] <
      nodes.
      super_vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
      .
      super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      ih.m_number._M_elems[3] = ih.m_number._M_elems[3] + 1) {
    digest32<160L>::digest32((digest32<160L> *)local_74);
    pcVar3 = digest32<160L>::data((digest32<160L> *)local_74);
    uVar1 = *(uint *)(_i + 0x10);
    *(uint *)(pcVar3 + 0x10) = uVar1;
    uVar2 = *(undefined8 *)(_i + 8);
    *(undefined8 *)pcVar3 = *(undefined8 *)_i;
    *(undefined8 *)(pcVar3 + 8) = uVar2;
    _i = _i + 0x14;
    detail::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char_const*&>
              ((basic_endpoint<boost::asio::ip::udp> *)&v6_ptr,(detail *)&i,(char **)(ulong)uVar1);
    std::
    vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
    ::
    emplace_back<libtorrent::digest32<160l>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
              ((vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
                *)local_40,(digest32<160L> *)local_74,
               (basic_endpoint<boost::asio::ip::udp> *)&v6_ptr);
  }
  ih_1.m_number._M_elems[4] = v6_nodes_idx.m_idx;
  _i_1 = libtorrent::aux::stack_allocator::ptr(alloc,v6_nodes_idx);
  for (ih_1.m_number._M_elems[3] = 0;
      (int)ih_1.m_number._M_elems[3] <
      (int)nodes.
           super_vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
           .
           super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ih_1.m_number._M_elems[3] = ih_1.m_number._M_elems[3] + 1) {
    digest32<160L>::digest32((digest32<160L> *)local_b4);
    pcVar3 = digest32<160L>::data((digest32<160L> *)local_b4);
    uVar1 = *(uint *)(_i_1 + 0x10);
    *(uint *)(pcVar3 + 0x10) = uVar1;
    uVar2 = *(undefined8 *)(_i_1 + 8);
    *(undefined8 *)pcVar3 = *(undefined8 *)_i_1;
    *(undefined8 *)(pcVar3 + 8) = uVar2;
    _i_1 = _i_1 + 0x14;
    detail::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char_const*&>
              (&local_d0,(detail *)&i_1,(char **)(ulong)uVar1);
    std::
    vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
    ::
    emplace_back<libtorrent::digest32<160l>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
              ((vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
                *)local_40,(digest32<160L> *)local_b4,&local_d0);
  }
  std::
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ::vector(__return_storage_ptr__,
           (vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
            *)local_40);
  libtorrent::aux::
  container_wrapper<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_int,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>_>
  ::~container_wrapper
            ((container_wrapper<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_int,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>_>
              *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<sha1_hash, udp::endpoint>> read_nodes(
		aux::stack_allocator const& alloc
		, int const v4_num_nodes, aux::allocation_slot const v4_nodes_idx
		, int const v6_num_nodes, aux::allocation_slot const v6_nodes_idx)
	{
		aux::vector<std::pair<sha1_hash, udp::endpoint>> nodes;
		nodes.reserve(v4_num_nodes + v6_num_nodes);

		char const* v4_ptr = alloc.ptr(v4_nodes_idx);
		for (int i = 0; i < v4_num_nodes; i++)
		{
			sha1_hash ih;
			std::memcpy(ih.data(), v4_ptr, 20);
			v4_ptr += 20;
			nodes.emplace_back(ih, detail::read_v4_endpoint<udp::endpoint>(v4_ptr));
		}
		char const* v6_ptr = alloc.ptr(v6_nodes_idx);
		for (int i = 0; i < v6_num_nodes; i++)
		{
			sha1_hash ih;
			std::memcpy(ih.data(), v6_ptr, 20);
			v6_ptr += 20;
			nodes.emplace_back(ih, detail::read_v6_endpoint<udp::endpoint>(v6_ptr));
		}

		return std::move(nodes);
	}